

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffvcfm(fitsfile *gfptr,int xtensionCol,int extnameCol,int extverCol,int positionCol,
          int locationCol,int uriCol,int *status)

{
  long local_40;
  long width;
  long repeat;
  int typecode;
  int locationCol_local;
  int positionCol_local;
  int extverCol_local;
  int extnameCol_local;
  int xtensionCol_local;
  fitsfile *gfptr_local;
  
  repeat._0_4_ = 0;
  width = 0;
  local_40 = 0;
  if (*status == 0) {
    repeat._4_4_ = locationCol;
    typecode = positionCol;
    locationCol_local = extverCol;
    positionCol_local = extnameCol;
    extverCol_local = xtensionCol;
    _extnameCol_local = gfptr;
    if ((xtensionCol == 0) ||
       ((((ffgtcl(gfptr,xtensionCol,(int *)&repeat,&width,&local_40,status), *status == 0 &&
          ((int)repeat == 0x10)) && (width == local_40)) && (width < 9)))) {
      if ((positionCol_local == 0) ||
         (((ffgtcl(_extnameCol_local,positionCol_local,(int *)&repeat,&width,&local_40,status),
           *status == 0 && ((int)repeat == 0x10)) && ((width == local_40 && (width < 0x21)))))) {
        if ((locationCol_local == 0) ||
           (((ffgtcl(_extnameCol_local,locationCol_local,(int *)&repeat,&width,&local_40,status),
             *status == 0 && ((int)repeat == 0x29)) && (width < 2)))) {
          if ((typecode == 0) ||
             (((ffgtcl(_extnameCol_local,typecode,(int *)&repeat,&width,&local_40,status),
               *status == 0 && ((int)repeat == 0x29)) && (width < 2)))) {
            if ((repeat._4_4_ == 0) ||
               (((ffgtcl(_extnameCol_local,repeat._4_4_,(int *)&repeat,&width,&local_40,status),
                 *status == 0 && ((int)repeat == 0x10)) && ((width == local_40 && (width < 0x101))))
               )) {
              if ((uriCol != 0) &&
                 (((ffgtcl(_extnameCol_local,uriCol,(int *)&repeat,&width,&local_40,status),
                   *status != 0 || ((int)repeat != 0x10)) || ((width != local_40 || (3 < width))))))
              {
                if (*status == 0) {
                  *status = 0x154;
                }
                ffpmsg("Wrong format for Grouping URI col. (ffvcfm)");
              }
            }
            else {
              if (*status == 0) {
                *status = 0x154;
              }
              ffpmsg("Wrong format for Grouping location col. (ffvcfm)");
            }
          }
          else {
            if (*status == 0) {
              *status = 0x154;
            }
            ffpmsg("Wrong format for Grouping position col. (ffvcfm)");
          }
        }
        else {
          if (*status == 0) {
            *status = 0x154;
          }
          ffpmsg("Wrong format for Grouping version col. (ffvcfm)");
        }
      }
      else {
        if (*status == 0) {
          *status = 0x154;
        }
        ffpmsg("Wrong format for Grouping name col. (ffvcfm)");
      }
    }
    else {
      if (*status == 0) {
        *status = 0x154;
      }
      ffpmsg("Wrong format for Grouping xtension col. (ffvcfm)");
    }
    gfptr_local._4_4_ = *status;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffvcfm(fitsfile *gfptr, int xtensionCol, int extnameCol, int extverCol,
	   int positionCol, int locationCol, int uriCol, int *status)
{
/*
   Perform validation on column formats to ensure this matches the grouping
   format the get functions expect.  Particularly want to check widths of
   string columns.
*/

   int typecode=0;
   long repeat=0, width=0;
   
   if (*status != 0) return (*status);
   
   do {
       if (xtensionCol)
       {
          fits_get_coltype(gfptr, xtensionCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 8)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping xtension col. (ffvcfm)");
             continue;
          }          
       }
       if (extnameCol)
       {
          fits_get_coltype(gfptr, extnameCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 32)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping name col. (ffvcfm)");
             continue;
          }          
       }
       if (extverCol)
       {
          fits_get_coltype(gfptr, extverCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TINT32BIT ||  repeat > 1)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping version col. (ffvcfm)");
             continue;
          }          
       }
       if (positionCol)
       {
          fits_get_coltype(gfptr, positionCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TINT32BIT ||  repeat > 1)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping position col. (ffvcfm)");
             continue;
          }          
       }
       if (locationCol)
       {
          fits_get_coltype(gfptr, locationCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 256)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping location col. (ffvcfm)");
             continue;
          }          
       }
       if (uriCol)
       {
          fits_get_coltype(gfptr, uriCol, &typecode, &repeat, &width, status);
          if (*status || typecode != TSTRING || repeat != width || repeat > 3)
          {
             if (*status==0) *status=NOT_GROUP_TABLE;
             ffpmsg("Wrong format for Grouping URI col. (ffvcfm)");
             continue;
          }          
       }
   } while (0);
   return (*status);
}